

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O1

void __thiscall
jrtplib::
RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
::~RTPHashTable(RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
                *this)

{
  ~RTPHashTable(this);
  operator_delete(this,0x10418);
  return;
}

Assistant:

~RTPHashTable()						{ Clear(); }